

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ostream * Catch::operator<<(ostream *os,Version *version)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((version->branchName)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(version->branchName)._M_dataplus._M_p,
                        (version->branchName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, Version const& version ) {
        os  << version.majorVersion << "."
            << version.minorVersion << "."
            << version.patchNumber;

        if( !version.branchName.empty() ) {
            os  << "-" << version.branchName
                << "." << version.buildNumber;
        }
        return os;
    }